

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O1

void anon_unknown.dwarf_23d32::die(char *str)

{
  raw_ostream *prVar1;
  long lVar2;
  StringRef Str;
  StringRef Str_00;
  
  prVar1 = (raw_ostream *)llvm::errs();
  Str.Length = 10;
  Str.Data = "ABORTING: ";
  prVar1 = llvm::raw_ostream::operator<<(prVar1,Str);
  prVar1 = llvm::raw_ostream::operator<<(prVar1,str);
  Str_00.Length = 1;
  Str_00.Data = "\n";
  llvm::raw_ostream::operator<<(prVar1,Str_00);
  if ((anonymous_namespace)::Init == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
    *(undefined1 *)((anonymous_namespace)::Shmem + 0x1490) = 1;
    lVar2 = 0x38;
    do {
      pthread_cond_broadcast((pthread_cond_t *)((anonymous_namespace)::Shmem + lVar2));
      lVar2 = lVar2 + 0x30;
    } while (lVar2 != 0x12f8);
    pthread_mutex_unlock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  }
  else {
    *(undefined1 *)((anonymous_namespace)::Shmem + 0x1490) = 1;
  }
  exit(-1);
}

Assistant:

void die(const char *str) {
  errs() << "ABORTING: " << str << "\n";
  if (Init) {
    // not checking return value here...
    pthread_mutex_lock(&Shmem->Lock);
    Shmem->Stop = true;
    for (int i = 0; i < MAX_DEPTH; ++i)
      pthread_cond_broadcast(&Shmem->Cond[i]);
    pthread_mutex_unlock(&Shmem->Lock);
  } else {
    Shmem->Stop = true;
  }
  exit(-1);
}